

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# MessageFederateExport.cpp
# Opt level: O1

HelicsMessage helicsEndpointCreateMessage(HelicsEndpoint endpoint,HelicsError *err)

{
  HelicsEndpoint pvVar1;
  Message *pMVar2;
  bool bVar3;
  
  if ((err == (HelicsError *)0x0) || (err->error_code == 0)) {
    if (endpoint == (HelicsEndpoint)0x0) {
      if (err == (HelicsError *)0x0) goto LAB_001aeffd;
    }
    else {
      bVar3 = *(int *)((long)endpoint + 0x20) == -0x4bac6b3e;
      pvVar1 = (HelicsEndpoint)0x0;
      if (bVar3) {
        pvVar1 = endpoint;
      }
      if (bVar3 || err == (HelicsError *)0x0) goto LAB_001aefff;
    }
    err->error_code = -3;
    err->message = "The given endpoint does not point to a valid object";
  }
LAB_001aeffd:
  pvVar1 = (HelicsEndpoint)0x0;
LAB_001aefff:
  if ((pvVar1 != (HelicsEndpoint)0x0) && (*(long *)((long)pvVar1 + 8) != 0)) {
    pMVar2 = helics::MessageHolder::newMessage
                       ((MessageHolder *)(*(long *)((long)pvVar1 + 8) + 0x20));
    return pMVar2;
  }
  return (HelicsMessage)0x0;
}

Assistant:

helics::EndpointObject* verifyEndpoint(HelicsEndpoint ept, HelicsError* err)
{
    HELICS_ERROR_CHECK(err, nullptr);
    auto* endObj = reinterpret_cast<helics::EndpointObject*>(ept);
    if (endObj == nullptr || endObj->valid != EndpointValidationIdentifier) {
        assignError(err, HELICS_ERROR_INVALID_OBJECT, invalidEndpoint);
        return nullptr;
    }
    return endObj;
}